

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readSEND.hpp
# Opt level: O1

void njoy::ENDFtk::section::BaseWithoutMT<njoy::ENDFtk::section::Type<7,4>>::
     readSEND<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *it,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *end,long *lineNumber,int MAT,int MF)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  long lVar1;
  bool bVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  undefined8 *puVar4;
  char *args;
  StructureDivision division;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  StructureDivision local_68;
  
  begin = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           )it->_M_current;
  StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_68,begin,it,end,lineNumber);
  bVar2 = StructureDivision::isSendPermissive(&local_68);
  if ((bVar2 && local_68.tail.fields._M_elems[1] != 0) && (0 < local_68.tail.fields._M_elems[0])) {
    if (local_68.tail.fields._M_elems[0] == MAT) {
      if (local_68.tail.fields._M_elems[1] == MF) {
        return;
      }
      tools::Log::error<char_const*>("Incorrect File number (MF) in SEND record");
      tools::Log::info<char_const*,int>("Expected MF = {}",MF);
      args = "Encountered MF = {}";
    }
    else {
      tools::Log::error<char_const*>("Incorrect Material number (MAT) in SEND record.");
      tools::Log::info<char_const*,int>("Expected MAT = {}",MAT);
      args = "Encountered MAT = {}";
      local_68.tail.fields._M_elems[1] = local_68.tail.fields._M_elems[0];
    }
    tools::Log::info<char_const*,int>(args,local_68.tail.fields._M_elems[1]);
  }
  else {
    tools::Log::error<char_const*>("Malformatted SEND record.");
    lVar1 = *lineNumber;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (begin._M_current,end->_M_current);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_88,begin._M_current,_Var3._M_current);
    tools::Log::info<char_const*,long,std::__cxx11::string>
              ("Error parsing line {}: \"{}\"",lVar1 + -1,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = getenv;
  __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void readSEND
( Iterator& it, const Iterator& end, long& lineNumber, int MAT, int MF ) {

  try {

    const auto begin = it;
    auto division = StructureDivision( it, end, lineNumber );
    if ( not division.isSend() ) {

      Log::error( "Malformatted SEND record." );
      Log::info( "Error parsing line {}: \"{}\"",
                 lineNumber - 1,
                 std::string( begin, std::find( begin, end, '\n' ) ) );
      throw std::exception();
    }

    if ( MAT != division.tail.MAT() ) {

      Log::error( "Incorrect Material number (MAT) in SEND record." );
      Log::info( "Expected MAT = {}", MAT );
      Log::info( "Encountered MAT = {}", division.tail.MAT() );
      throw std::exception();
    }

    if ( MF != division.tail.MF() ) {

      Log::error( "Incorrect File number (MF) in SEND record" );
      Log::info( "Expected MF = {}", MF );
      Log::info( "Encountered MF = {}", division.tail.MF() );
      throw std::exception();
    }
  } catch ( std::exception& e ){
    Log::info( "Encountered error while reading the SEND record." );
    throw e;
  }
}